

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

void google::protobuf::TextFormat::OutOfLinePrintString<char[16]>
               (BaseTextGenerator *generator,char (*values) [16])

{
  string local_60;
  string_view local_40 [3];
  
  local_40[0] = absl::lts_20250127::NullSafeStringView(*values);
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_60,(lts_20250127 *)local_40,(AlphaNum *)local_40[0]._M_str);
  (*generator->_vptr_BaseTextGenerator[5])
            (generator,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

PROTOBUF_NOINLINE void TextFormat::OutOfLinePrintString(
    BaseTextGenerator* generator, const T&... values) {
  generator->PrintString(absl::StrCat(values...));
}